

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O1

void __thiscall
Function_Pool::FunctionPoolTask::_setup
          (FunctionPoolTask *this,Image *in,uint32_t inX,uint32_t inY,Image *out,uint32_t outX,
          uint32_t outY,uint32_t width,uint32_t height)

{
  InputImageInfo *__ptr;
  OutputImageInfo *__ptr_00;
  bool bVar1;
  uint32_t uVar2;
  InputImageInfo *this_00;
  OutputImageInfo *this_01;
  imageException *this_02;
  pointer __p;
  InputImageInfo *local_40;
  Image *local_38;
  
  local_38 = out;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,inX,inY,out,outX,outY,width,height);
  bVar1 = AbstractTaskProvider::_ready((AbstractTaskProvider *)this);
  if (bVar1) {
    this_00 = (InputImageInfo *)operator_new(0x68);
    uVar2 = anon_unknown.dwarf_d93a2::threadCount();
    AreaInfo::AreaInfo((AreaInfo *)this_00,inX,inY,width,height,uVar2);
    this_00->image = in;
    local_40 = (InputImageInfo *)0x0;
    __ptr = (this->_infoIn1)._M_t.
            super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
            ._M_t.
            super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
            .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
    (this->_infoIn1)._M_t.
    super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
    ._M_t.
    super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
    .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl = this_00;
    if (__ptr != (InputImageInfo *)0x0) {
      std::default_delete<Function_Pool::InputImageInfo>::operator()
                ((default_delete<Function_Pool::InputImageInfo> *)&this->_infoIn1,__ptr);
    }
    if (local_40 != (InputImageInfo *)0x0) {
      std::default_delete<Function_Pool::InputImageInfo>::operator()
                ((default_delete<Function_Pool::InputImageInfo> *)&local_40,local_40);
    }
    this_01 = (OutputImageInfo *)operator_new(0x68);
    uVar2 = anon_unknown.dwarf_d93a2::threadCount();
    AreaInfo::AreaInfo((AreaInfo *)this_01,outX,outY,width,height,uVar2);
    this_01->image = local_38;
    local_40 = (InputImageInfo *)0x0;
    __ptr_00 = (this->_infoOut)._M_t.
               super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
               .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
    (this->_infoOut)._M_t.
    super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ._M_t.
    super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
    .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl = this_01;
    if (__ptr_00 != (OutputImageInfo *)0x0) {
      std::default_delete<Function_Pool::OutputImageInfo>::operator()
                ((default_delete<Function_Pool::OutputImageInfo> *)&this->_infoOut,__ptr_00);
    }
    if (local_40 != (InputImageInfo *)0x0) {
      std::default_delete<Function_Pool::OutputImageInfo>::operator()
                ((default_delete<Function_Pool::OutputImageInfo> *)&local_40,
                 (OutputImageInfo *)local_40);
    }
    return;
  }
  this_02 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_02,"FunctionTask object was called multiple times!");
  __cxa_throw(this_02,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void FunctionPoolTask::_setup( const Image & in, uint32_t inX, uint32_t inY, Image & out, uint32_t outX, uint32_t outY, uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( in, inX, inY, out, outX, outY, width, height );

        if( !_ready() )
            throw imageException( "FunctionTask object was called multiple times!" );

        _infoIn1 = std::unique_ptr < InputImageInfo  >( new InputImageInfo ( in, inX, inY, width, height, threadCount() ) );
        _infoOut = std::unique_ptr < OutputImageInfo >( new OutputImageInfo( out, outX, outY, width, height, threadCount() ) );
    }